

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  undefined8 target_00;
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  char cVar5;
  int iVar6;
  Result RVar7;
  TargetType TVar8;
  size_type sVar9;
  const_reference pvVar10;
  ulong uVar11;
  cmMakefile *this_00;
  string *psVar12;
  ostream *poVar13;
  char *pcVar14;
  char *pcVar15;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar17;
  char *local_a18;
  char *local_9f0;
  char *local_9c8;
  char *local_9a0;
  char *local_978;
  char *local_950;
  cmGeneratorTarget *local_928;
  allocator<char> local_779;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  allocator<char> local_751;
  string local_750;
  undefined1 local_72a;
  allocator<char> local_729;
  char *local_728;
  char *propContent_4;
  char *local_718;
  char *propContent_3;
  char *local_708;
  char *propContent_2;
  char *local_6f8;
  char *propContent_1;
  char *local_6e8;
  char *propContent;
  string local_6d8;
  cmLinkImplementationLibraries *local_6b8;
  cmLinkImplementationLibraries *impl;
  cmLinkInterfaceLibraries *local_690;
  cmLinkInterfaceLibraries *iface;
  cmGeneratorTarget *headTarget;
  PolicyStatus polSt;
  bool isInterfaceProperty;
  string interfacePropertyName;
  string linkedTargetsContent;
  string local_630;
  string local_610;
  char *local_5f0;
  char *prop;
  size_t i;
  string local_5c0;
  cmListFileBacktrace local_5a0;
  undefined1 local_590 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_508;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  string local_458;
  _Base_ptr local_438;
  undefined1 local_430;
  _Base_ptr local_428;
  undefined1 local_420;
  _Base_ptr local_418;
  undefined1 local_410;
  string local_408;
  string local_3e8;
  undefined1 local_3c8 [8];
  ostringstream e;
  allocator<char> local_249;
  cmGeneratorTarget *local_248;
  cmGeneratorTarget *tgt;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  string targetName;
  string local_188;
  string local_168;
  allocator<char> local_141;
  string local_140;
  string local_120;
  int local_100;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  string propertyName;
  cmGeneratorTarget *target;
  allocator<char> local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetPropertyNode *this_local;
  string *result;
  
  local_38 = dagCheckerParent;
  dagCheckerParent_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (TargetPropertyNode *)__return_storage_ptr__;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(parameters);
  if ((sVar9 != 1) &&
     (sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local), pGVar1 = content_local, sVar9 != 2)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_58,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters",&local_79);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar6 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  propertyName.field_2._8_8_ =
       content_local[4].ParamChildren.
       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pvVar10 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)context_local);
  std::__cxx11::string::string((string *)local_b8,(string *)pvVar10);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local);
  if (sVar9 == 1) {
    *(undefined1 *)((long)&content_local[4].StartContent + 3) = 1;
  }
  if ((propertyName.field_2._8_8_ == 0) &&
     (sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local), pGVar1 = content_local, sVar9 == 1)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_d8,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,&local_f9);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_d8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_100 = 1;
    goto LAB_00656db2;
  }
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local);
  if (sVar9 == 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)context_local);
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)context_local,1);
      uVar11 = std::__cxx11::string::empty();
      pGVar1 = content_local;
      if ((uVar11 & 1) != 0) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_120,(GeneratorExpressionContent *)dagCheckerParent_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,
                   "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                   ,&local_141);
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_120,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator(&local_141);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_100 = 1;
        goto LAB_00656db2;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)context_local);
    uVar11 = std::__cxx11::string::empty();
    pGVar1 = content_local;
    if ((uVar11 & 1) != 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_168,(GeneratorExpressionContent *)dagCheckerParent_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,
                 "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.",
                 (allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_168,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_100 = 1;
      goto LAB_00656db2;
    }
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)context_local);
    std::__cxx11::string::string((string *)local_1b0,(string *)pvVar10);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)context_local,1);
    std::__cxx11::string::operator=((string *)local_b8,(string *)pvVar10);
    bVar2 = cmGeneratorExpression::IsValidTargetName((string *)local_1b0);
    if (bVar2) {
      if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
           ::propALIASED_TARGET_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                       ::propALIASED_TARGET_abi_cxx11_), iVar6 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                    ::propALIASED_TARGET_abi_cxx11_,"ALIASED_TARGET",
                   (allocator<char> *)((long)&tgt + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&tgt + 6));
        __cxa_atexit(std::__cxx11::string::~string,
                     &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                      ::propALIASED_TARGET_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                             ::propALIASED_TARGET_abi_cxx11_);
      }
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                        ::propALIASED_TARGET_abi_cxx11_);
      if (_Var3) {
        this_00 = cmLocalGenerator::GetMakefile
                            ((cmLocalGenerator *)
                             content_local[3].ParamChildren.
                             super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        bVar2 = cmMakefile::IsAlias(this_00,(string *)local_1b0);
        if ((bVar2) &&
           (local_248 = cmLocalGenerator::FindGeneratorTargetToUse
                                  ((cmLocalGenerator *)
                                   content_local[3].ParamChildren.
                                   super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(string *)local_1b0),
           local_248 != (cmGeneratorTarget *)0x0)) {
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_248);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar12);
          local_100 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_249);
          std::allocator<char>::~allocator(&local_249);
          local_100 = 1;
        }
      }
      else {
        propertyName.field_2._8_8_ =
             cmLocalGenerator::FindGeneratorTargetToUse
                       ((cmLocalGenerator *)
                        content_local[3].ParamChildren.
                        super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(string *)local_1b0);
        if ((cmGeneratorTarget *)propertyName.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
          poVar13 = std::operator<<((ostream *)local_3c8,"Target \"");
          poVar13 = std::operator<<(poVar13,(string *)local_1b0);
          std::operator<<(poVar13,"\" not found.");
          pGVar1 = content_local;
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&local_3e8,(GeneratorExpressionContent *)dagCheckerParent_local);
          std::__cxx11::ostringstream::str();
          reportError((cmGeneratorExpressionContext *)pGVar1,&local_3e8,&local_408);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          local_100 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
        }
        else {
          pVar17 = std::
                   set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                             *)&content_local->ContentLength,
                            (value_type *)((long)&propertyName.field_2 + 8));
          local_418 = (_Base_ptr)pVar17.first._M_node;
          local_410 = pVar17.second;
          local_100 = 0;
        }
      }
    }
    else {
      bVar2 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,(string *)local_b8);
      pGVar1 = content_local;
      if (bVar2) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_218,(GeneratorExpressionContent *)dagCheckerParent_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"Target name not supported.",
                   (allocator<char> *)((long)&tgt + 7));
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_218,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tgt + 7));
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_100 = 1;
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_1d0,(GeneratorExpressionContent *)dagCheckerParent_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"Target name and property name not supported.",&local_1f1);
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_1d0,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_100 = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_1b0);
    if (local_100 != 0) goto LAB_00656db2;
  }
  if ((pointer)propertyName.field_2._8_8_ ==
      content_local[4].ParamChildren.
      super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pVar16 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&content_local[1].ParamChildren.
                          super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(value_type *)local_b8);
    local_428 = (_Base_ptr)pVar16.first._M_node;
    local_420 = pVar16.second;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,"SOURCES");
  if (bVar2) {
    pVar17 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)&content_local[2].IdentifierChildren.
                          super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                      (value_type *)((long)&propertyName.field_2 + 8));
    local_438 = (_Base_ptr)pVar17.first._M_node;
    local_430 = pVar17.second;
  }
  uVar11 = std::__cxx11::string::empty();
  pGVar1 = content_local;
  if ((uVar11 & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_458,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,
               "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",&local_479);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_458,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_100 = 1;
    goto LAB_00656db2;
  }
  bVar2 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,(string *)local_b8);
  pGVar1 = content_local;
  if (!bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_4a0,(GeneratorExpressionContent *)dagCheckerParent_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"Property name not supported.",&local_4c1);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_4a0,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_100 = 1;
    goto LAB_00656db2;
  }
  if (propertyName.field_2._8_8_ == 0) {
    __assert_fail("target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                  ,0x516,
                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                 );
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,"LINKER_LANGUAGE");
  if (bVar2) {
    bVar2 = cmGeneratorTarget::LinkLanguagePropagatesToDependents
                      ((cmGeneratorTarget *)propertyName.field_2._8_8_);
    if (((bVar2) && (local_38 != (cmGeneratorExpressionDAGChecker *)0x0)) &&
       ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                           (local_38,(cmGeneratorTarget *)0x0), bVar2 ||
        (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(local_38), bVar2)))) {
      pGVar1 = content_local;
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_4e8,(GeneratorExpressionContent *)dagCheckerParent_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_508,
                 "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                 ,(allocator<char> *)&dagChecker.field_0x7f);
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_4e8,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator((allocator<char> *)&dagChecker.field_0x7f);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_100 = 1;
    }
    else {
      cmGeneratorTarget::GetLinkerLanguage
                (__return_storage_ptr__,(cmGeneratorTarget *)propertyName.field_2._8_8_,
                 (string *)
                 &content_local[3].ParamChildren.
                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_100 = 1;
    }
    goto LAB_00656db2;
  }
  cmListFileBacktrace::cmListFileBacktrace(&local_5a0,(cmListFileBacktrace *)content_local);
  target_00 = propertyName.field_2._8_8_;
  std::__cxx11::string::string((string *)&local_5c0,(string *)local_b8);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_590,&local_5a0,(cmGeneratorTarget *)target_00,
             &local_5c0,(GeneratorExpressionContent *)dagCheckerParent_local,local_38);
  std::__cxx11::string::~string((string *)&local_5c0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_5a0);
  RVar7 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_590);
  pGVar1 = content_local;
  switch(RVar7) {
  case SELF_REFERENCE:
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&i,(GeneratorExpressionContent *)dagCheckerParent_local);
    cmGeneratorExpressionDAGChecker::ReportError
              ((cmGeneratorExpressionDAGChecker *)local_590,(cmGeneratorExpressionContext *)pGVar1,
               (string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_100 = 1;
    break;
  case CYCLIC_REFERENCE:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_100 = 1;
    break;
  case ALREADY_SEEN:
    for (prop = (char *)0x1; pcVar15 = prop,
        pcVar14 = (char *)std::size<char_const*,11ul>(&targetPropertyTransitiveWhitelist),
        pcVar15 < pcVar14; prop = prop + 1) {
      bVar2 = std::operator==(targetPropertyTransitiveWhitelist[(long)prop],
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8);
      if (bVar2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_100 = 1;
        goto LAB_00656d96;
      }
    }
  case DAG:
  default:
    local_5f0 = cmGeneratorTarget::GetProperty
                          ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8);
    if (((local_38 != (cmGeneratorExpressionDAGChecker *)0x0) &&
        (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(local_38), !bVar2)) &&
       (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(local_38), !bVar2)) {
      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (local_38,(cmGeneratorTarget *)0x0);
      if (bVar2) {
        bVar2 = std::operator==("INCLUDE_DIRECTORIES",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8);
        if ((((bVar2) ||
             (bVar2 = std::operator==("INTERFACE_INCLUDE_DIRECTORIES",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2)) ||
            (((bVar2 = std::operator==("SYSTEM_INCLUDE_DIRECTORIES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2 ||
              ((bVar2 = std::operator==("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2 ||
               (bVar2 = std::operator==("COMPILE_DEFINITIONS",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2)))) ||
             (bVar2 = std::operator==("INTERFACE_COMPILE_DEFINITIONS",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2)))) ||
           ((((((bVar2 = std::operator==("COMPILE_OPTIONS",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8), bVar2 ||
                (bVar2 = std::operator==("INTERFACE_COMPILE_OPTIONS",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8), bVar2)) ||
               (bVar2 = std::operator==("AUTOUIC_OPTIONS",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2)) ||
              (((bVar2 = std::operator==("INTERFACE_AUTOUIC_OPTIONS",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8), bVar2 ||
                (bVar2 = std::operator==("SOURCES",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8), bVar2)) ||
               ((bVar2 = std::operator==("INTERFACE_SOURCES",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_b8), bVar2 ||
                ((bVar2 = std::operator==("COMPILE_FEATURES",
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8), bVar2 ||
                 (bVar2 = std::operator==("INTERFACE_COMPILE_FEATURES",
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8), bVar2)))))))) ||
             (bVar2 = std::operator==("LINK_OPTIONS",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8), bVar2)) ||
            ((((bVar2 = std::operator==("INTERFACE_LINK_OPTIONS",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2 ||
               (bVar2 = std::operator==("LINK_DIRECTORIES",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8), bVar2)) ||
              (bVar2 = std::operator==("INTERFACE_LINK_DIRECTORIES",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2)) ||
             ((bVar2 = std::operator==("LINK_DEPENDS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2 ||
              (bVar2 = std::operator==("INTERFACE_LINK_DEPENDS",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_b8), bVar2)))))))) {
          pGVar1 = content_local;
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&local_610,(GeneratorExpressionContent *)dagCheckerParent_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_630,
                     "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                     ,(allocator<char> *)(linkedTargetsContent.field_2._M_local_buf + 0xf));
          reportError((cmGeneratorExpressionContext *)pGVar1,&local_610,&local_630);
          std::__cxx11::string::~string((string *)&local_630);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(linkedTargetsContent.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_610);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          local_100 = 1;
        }
        else {
          if (local_5f0 != (char *)0x0) goto LAB_00655d1a;
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          local_100 = 1;
        }
        break;
      }
      bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(local_38);
      bVar2 = true;
      if (!bVar4) {
        bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories(local_38);
        bVar2 = true;
        if (!bVar4) {
          bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(local_38);
          bVar2 = true;
          if (!bVar4) {
            bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(local_38);
            bVar2 = true;
            if (!bVar4) {
              bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions(local_38);
              bVar2 = true;
              if (!bVar4) {
                bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(local_38);
                bVar2 = true;
                if (!bVar4) {
                  bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures(local_38);
                  bVar2 = true;
                  if (!bVar4) {
                    bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions(local_38);
                    bVar2 = true;
                    if (!bVar4) {
                      bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories(local_38);
                      bVar2 = true;
                      if (!bVar4) {
                        bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends(local_38);
                        bVar2 = true;
                        if (!bVar4) {
                          bVar2 = false;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (!bVar2) {
        __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                      ,0x556,
                      "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                     );
      }
    }
LAB_00655d1a:
    std::__cxx11::string::string((string *)(interfacePropertyName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&polSt);
    headTarget._7_1_ = 0;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"INCLUDE_DIRECTORIES");
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_INCLUDE_DIRECTORIES");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"INTERFACE_INCLUDE_DIRECTORIES");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_INCLUDE_DIRECTORIES");
        headTarget._7_1_ = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"SYSTEM_INCLUDE_DIRECTORIES");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")
            ;
            headTarget._7_1_ = 1;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"COMPILE_DEFINITIONS");
            if (bVar2) {
              std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_DEFINITIONS");
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"INTERFACE_COMPILE_DEFINITIONS");
              if (bVar2) {
                std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_DEFINITIONS");
                headTarget._7_1_ = 1;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8,"COMPILE_OPTIONS");
                if (bVar2) {
                  std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_OPTIONS");
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8,"INTERFACE_COMPILE_OPTIONS");
                  if (bVar2) {
                    std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_COMPILE_OPTIONS");
                    headTarget._7_1_ = 1;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_b8,"AUTOUIC_OPTIONS");
                    if (bVar2) {
                      std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_AUTOUIC_OPTIONS");
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_b8,"INTERFACE_AUTOUIC_OPTIONS");
                      if (bVar2) {
                        std::__cxx11::string::operator=
                                  ((string *)&polSt,"INTERFACE_AUTOUIC_OPTIONS");
                        headTarget._7_1_ = 1;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_b8,"SOURCES");
                        if (bVar2) {
                          std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SOURCES");
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_SOURCES");
                          if (bVar2) {
                            std::__cxx11::string::operator=((string *)&polSt,"INTERFACE_SOURCES");
                            headTarget._7_1_ = 1;
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"COMPILE_FEATURES");
                            if (bVar2) {
                              std::__cxx11::string::operator=
                                        ((string *)&polSt,"INTERFACE_COMPILE_FEATURES");
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_COMPILE_FEATURES");
                              if (bVar2) {
                                std::__cxx11::string::operator=
                                          ((string *)&polSt,"INTERFACE_COMPILE_FEATURES");
                                headTarget._7_1_ = 1;
                              }
                              else {
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"LINK_OPTIONS");
                                if (bVar2) {
                                  std::__cxx11::string::operator=
                                            ((string *)&polSt,"INTERFACE_LINK_OPTIONS");
                                }
                                else {
                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_LINK_OPTIONS");
                                  if (bVar2) {
                                    std::__cxx11::string::operator=
                                              ((string *)&polSt,"INTERFACE_LINK_OPTIONS");
                                    headTarget._7_1_ = 1;
                                  }
                                  else {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"LINK_DIRECTORIES");
                                    if (bVar2) {
                                      std::__cxx11::string::operator=
                                                ((string *)&polSt,"INTERFACE_LINK_DIRECTORIES");
                                    }
                                    else {
                                      bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_LINK_DIRECTORIES");
                                      if (bVar2) {
                                        std::__cxx11::string::operator=
                                                  ((string *)&polSt,"INTERFACE_LINK_DIRECTORIES");
                                        headTarget._7_1_ = 1;
                                      }
                                      else {
                                        bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"LINK_DEPENDS");
                                        if (bVar2) {
                                          std::__cxx11::string::operator=
                                                    ((string *)&polSt,"INTERFACE_LINK_DEPENDS");
                                        }
                                        else {
                                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,"INTERFACE_LINK_DEPENDS");
                                          if (bVar2) {
                                            std::__cxx11::string::operator=
                                                      ((string *)&polSt,"INTERFACE_LINK_DEPENDS");
                                            headTarget._7_1_ = 1;
                                          }
                                          else {
                                            bVar2 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                                                              ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b8,(char (*) [21])"COMPILE_DEFINITIONS_");
                                            if ((bVar2) &&
                                               ((headTarget._0_4_ =
                                                      cmLocalGenerator::GetPolicyStatus
                                                                ((cmLocalGenerator *)
                                                                 content_local[3].ParamChildren.
                                                                                                                                  
                                                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,CMP0043
                                                  ), (PolicyStatus)headTarget == WARN ||
                                                ((PolicyStatus)headTarget == OLD)))) {
                                              std::__cxx11::string::operator=
                                                        ((string *)&polSt,
                                                         "INTERFACE_COMPILE_DEFINITIONS");
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((content_local[4].ParamChildren.
         super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
       ((headTarget._7_1_ & 1) == 0)) {
      local_928 = (cmGeneratorTarget *)propertyName.field_2._8_8_;
    }
    else {
      local_928 = (cmGeneratorTarget *)
                  content_local[4].ParamChildren.
                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    iface = (cmLinkInterfaceLibraries *)local_928;
    if ((headTarget._7_1_ & 1) == 0) {
      uVar11 = std::__cxx11::string::empty();
      if (((uVar11 & 1) == 0) &&
         (local_6b8 = cmGeneratorTarget::GetLinkImplementationLibraries
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                 (string *)
                                 &content_local[3].ParamChildren.
                                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage),
         local_6b8 != (cmLinkImplementationLibraries *)0x0)) {
        getLinkedTargetsContent<cmLinkImplItem>
                  (&local_6d8,&local_6b8->Libraries,(cmGeneratorTarget *)propertyName.field_2._8_8_,
                   (cmGeneratorTarget *)propertyName.field_2._8_8_,
                   (cmGeneratorExpressionContext *)content_local,
                   (cmGeneratorExpressionDAGChecker *)local_590,(string *)&polSt);
        std::__cxx11::string::operator=
                  ((string *)(interfacePropertyName.field_2._M_local_buf + 8),(string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_6d8);
      }
    }
    else {
      local_690 = cmGeneratorTarget::GetLinkInterfaceLibraries
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                             (string *)
                             &content_local[3].ParamChildren.
                              super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_928,true);
      if (local_690 != (cmLinkInterfaceLibraries *)0x0) {
        getLinkedTargetsContent<cmLinkItem>
                  ((string *)&impl,&local_690->Libraries,
                   (cmGeneratorTarget *)propertyName.field_2._8_8_,(cmGeneratorTarget *)iface,
                   (cmGeneratorExpressionContext *)content_local,
                   (cmGeneratorExpressionDAGChecker *)local_590,(string *)&polSt);
        std::__cxx11::string::operator=
                  ((string *)(interfacePropertyName.field_2._M_local_buf + 8),(string *)&impl);
        std::__cxx11::string::~string((string *)&impl);
      }
    }
    if (local_5f0 == (char *)0x0) {
      bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)propertyName.field_2._8_8_);
      if ((bVar2) ||
         (TVar8 = cmGeneratorTarget::GetType((cmGeneratorTarget *)propertyName.field_2._8_8_),
         TVar8 == INTERFACE_LIBRARY)) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (string *)(interfacePropertyName.field_2._M_local_buf + 8));
      }
      else {
        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                          ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                           (string *)
                           &content_local[3].ParamChildren.
                            super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
          bVar2 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                             (string *)
                             &content_local[3].ParamChildren.
                              super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            local_950 = "1";
          }
          else {
            local_950 = "0";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,local_950,
                     (allocator<char> *)((long)&propContent + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&propContent + 7));
        }
        else {
          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                             (string *)
                             &content_local[3].ParamChildren.
                              super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
            local_6e8 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                  ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                   (string *)local_b8,
                                   (string *)
                                   &content_local[3].ParamChildren.
                                    super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_978 = local_6e8;
            if (local_6e8 == (char *)0x0) {
              local_978 = "";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,local_978,
                       (allocator<char> *)((long)&propContent_1 + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_1 + 7));
          }
          else {
            bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                              ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                               (string *)
                               &content_local[3].ParamChildren.
                                super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar2) {
              *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
              local_6f8 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                    ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                     (string *)local_b8,
                                     (string *)
                                     &content_local[3].ParamChildren.
                                      super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_9a0 = local_6f8;
              if (local_6f8 == (char *)0x0) {
                local_9a0 = "";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,local_9a0,
                         (allocator<char> *)((long)&propContent_2 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_2 + 7));
            }
            else {
              bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                                 (string *)
                                 &content_local[3].ParamChildren.
                                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar2) {
                *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
                local_708 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      ((cmGeneratorTarget *)propertyName.field_2._8_8_,
                                       (string *)local_b8,
                                       (string *)
                                       &content_local[3].ParamChildren.
                                        super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_9c8 = local_708;
                if (local_708 == (char *)0x0) {
                  local_9c8 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,local_9c8,
                           (allocator<char> *)((long)&propContent_3 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_3 + 7));
              }
              else {
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,
                           (string *)(interfacePropertyName.field_2._M_local_buf + 8));
              }
            }
          }
        }
      }
    }
    else {
      bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)propertyName.field_2._8_8_);
      if (((bVar2) || (local_38 == (cmGeneratorExpressionDAGChecker *)0x0)) ||
         (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                            (local_38,(cmGeneratorTarget *)0x0), bVar2)) {
LAB_00656b30:
        uVar11 = std::__cxx11::string::empty();
        pcVar15 = local_5f0;
        if ((uVar11 & 1) == 0) {
          local_72a = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_750,pcVar15,&local_751);
          cmGeneratorExpressionNode::EvaluateDependentExpression
                    (__return_storage_ptr__,&local_750,
                     (cmLocalGenerator *)
                     content_local[3].ParamChildren.
                     super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (cmGeneratorExpressionContext *)content_local,(cmGeneratorTarget *)iface,
                     (cmGeneratorTarget *)propertyName.field_2._8_8_,
                     (cmGeneratorExpressionDAGChecker *)local_590);
          std::__cxx11::string::~string((string *)&local_750);
          std::allocator<char>::~allocator(&local_751);
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            cVar5 = std::__cxx11::string::empty();
            pcVar15 = ";";
            if (cVar5 != '\0') {
              pcVar15 = "";
            }
            std::operator+(&local_778,pcVar15,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&interfacePropertyName.field_2 + 8));
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_778);
            std::__cxx11::string::~string((string *)&local_778);
          }
          local_72a = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar15,&local_779);
          std::allocator<char>::~allocator(&local_779);
        }
      }
      else {
        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                          ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                           (string *)
                           &content_local[3].ParamChildren.
                            super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
          local_718 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                                 (string *)
                                 &content_local[3].ParamChildren.
                                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_9f0 = local_718;
          if (local_718 == (char *)0x0) {
            local_9f0 = "";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,local_9f0,
                     (allocator<char> *)((long)&propContent_4 + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_4 + 7));
        }
        else {
          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                            ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                             (string *)
                             &content_local[3].ParamChildren.
                              super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar2) goto LAB_00656b30;
          *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
          local_728 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                ((cmGeneratorTarget *)propertyName.field_2._8_8_,(string *)local_b8,
                                 (string *)
                                 &content_local[3].ParamChildren.
                                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_a18 = local_728;
          if (local_728 == (char *)0x0) {
            local_a18 = "";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,local_a18,&local_729);
          std::allocator<char>::~allocator(&local_729);
        }
      }
    }
    local_100 = 1;
    std::__cxx11::string::~string((string *)&polSt);
    std::__cxx11::string::~string((string *)(interfacePropertyName.field_2._M_local_buf + 8));
  }
LAB_00656d96:
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_590);
LAB_00656db2:
  std::__cxx11::string::~string((string *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    if (parameters.size() != 1 && parameters.size() != 2) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = parameters.front();

    if (parameters.size() == 1) {
      context->HadHeadSensitiveCondition = true;
    }
    if (!target && parameters.size() == 1) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
        "It may not be used with add_custom_command or add_custom_target.  "
        "Specify the target to read a property from using the "
        "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
    }

    if (parameters.size() == 2) {
      if (parameters.front().empty() && parameters[1].empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name and property name.");
        return std::string();
      }
      if (parameters.front().empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name.");
        return std::string();
      }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
        if (!propertyNameValidator.find(propertyName)) {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
        }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
      }
      static const std::string propALIASED_TARGET = "ALIASED_TARGET";
      if (propertyName == propALIASED_TARGET) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return "";
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);
    }

    if (target == context->HeadTarget) {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
    }
    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    const char* prop = target->GetProperty(propertyName);

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!prop) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!prop) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }